

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

NameSet * __thiscall
wasm::BranchUtils::BranchSeekerCache::getBranches(BranchSeekerCache *this,Expression *curr)

{
  size_t *__k;
  Index IVar1;
  iterator iVar2;
  Expression **ppEVar3;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this_00;
  AbstractChildIterator<wasm::ChildIterator> *pAVar4;
  Iterator IVar5;
  AbstractChildIterator<wasm::ChildIterator> local_1d8;
  undefined1 auStack_198 [8];
  NameSet selfBranches;
  NameSet local_c0;
  undefined1 local_90 [8];
  NameSet currBranches;
  Expression *child;
  Iterator local_50;
  Expression *local_40;
  Expression *curr_local;
  anon_class_8_1_f8498820 add;
  
  local_40 = curr;
  iVar2 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_40);
  if (iVar2.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&currBranches;
    currBranches._M_t._M_impl._0_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    curr_local = (Expression *)local_90;
    currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         currBranches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_1d8,local_40);
    local_50.index = 0;
    local_50.parent = &local_1d8;
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::end(&local_1d8);
    IVar1 = 0;
    __k = &currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pAVar4 = &local_1d8;
    while ((IVar1 != IVar5.index || (pAVar4 != IVar5.parent))) {
      ppEVar3 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_50);
      currBranches._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppEVar3;
      iVar2 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,(key_type *)__k);
      if (iVar2.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        auStack_198 = (undefined1  [8])0x0;
        selfBranches._M_t._M_impl._0_8_ = 0;
        local_c0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c0._M_t._M_impl.super__Rb_tree_header._M_header;
        local_c0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
        ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                *)auStack_198,(Expression **)__k);
        getBranches::anon_class_8_1_f8498820::operator()
                  ((anon_class_8_1_f8498820 *)&curr_local,&local_c0);
        BranchAccumulator::~BranchAccumulator((BranchAccumulator *)auStack_198);
      }
      else {
        getBranches::anon_class_8_1_f8498820::operator()
                  ((anon_class_8_1_f8498820 *)&curr_local,
                   (NameSet *)
                   ((long)iVar2.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                          ._M_cur + 0x10));
        std::
        _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this,(const_iterator)
                        iVar2.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                        ._M_cur);
      }
      IVar1 = local_50.index + 1;
      pAVar4 = local_50.parent;
      local_50.index = IVar1;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_1d8.children.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
    getUniqueTargets((NameSet *)auStack_198,local_40);
    getBranches::anon_class_8_1_f8498820::operator()
              ((anon_class_8_1_f8498820 *)&curr_local,(NameSet *)auStack_198);
    this_00 = &std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_40)->_M_t;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::operator=(this_00,(_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)local_90);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_198);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_90);
  }
  else {
    this_00 = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)iVar2.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>,_false>
                        ._M_cur + 0x10);
  }
  return (NameSet *)this_00;
}

Assistant:

const NameSet& getBranches(Expression* curr) {
    auto iter = branches.find(curr);
    if (iter != branches.end()) {
      return iter->second;
    }
    NameSet currBranches;
    auto add = [&](NameSet& moreBranches) {
      // Make sure to do a fast swap for the first set of branches to arrive.
      // This helps the case of the first child being a block with a very large
      // set of names.
      if (currBranches.empty()) {
        currBranches.swap(moreBranches);
      } else {
        currBranches.insert(moreBranches.begin(), moreBranches.end());
      }
    };
    // Add from the children, which are hopefully cached.
    for (auto child : ChildIterator(curr)) {
      auto iter = branches.find(child);
      if (iter != branches.end()) {
        add(iter->second);
        // We are scanning the parent, which means we assume the child will
        // never be visited again.
        branches.erase(iter);
      } else {
        // The child was not cached. Scan it manually.
        BranchAccumulator childBranches;
        childBranches.walk(child);
        add(childBranches.branches);
        // Don't bother caching anything - we are scanning the parent, so the
        // child will presumably not be scanned again.
      }
    }
    // Finish with the parent's own branches.
    auto selfBranches = getUniqueTargets(curr);
    add(selfBranches);
    return branches[curr] = std::move(currBranches);
  }